

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void notify_free_handler_and_close_stream(cio_http_client *client)

{
  cio_http_client *client_local;
  
  free_handler(client);
  close_bs(client);
  return;
}

Assistant:

static void notify_free_handler_and_close_stream(struct cio_http_client *client)
{
	free_handler(client);
	close_bs(client);
}